

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_gramma.hpp
# Opt level: O3

void __thiscall InputStatement::LogOutput(InputStatement *this)

{
  string str;
  string local_30;
  
  local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_30,"This is a input statement","");
  LogTools::GrammaNormalLogs(g_log_tools,&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  return;
}

Assistant:

void LogOutput() {
        string str("This is a switch child statement");
        g_log_tools->GrammaNormalLogs(str);
    }